

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzautopointer.h
# Opt level: O0

TPZAutoPointer<TPZDohrAssembly<float>_>
TPZAutoPointerDynamicCast<TPZDohrAssembly<float>,TPZSavable>(TPZAutoPointer<TPZSavable> *in)

{
  undefined8 *in_RSI;
  TPZReference *in_RDI;
  TPZDohrAssembly<float> *p;
  TPZAutoPointer<TPZDohrAssembly<float>_> *rv;
  TPZDohrAssembly<float> *this;
  long local_48;
  TPZReference *pTVar1;
  
  pTVar1 = in_RDI;
  TPZAutoPointer<TPZDohrAssembly<float>_>::TPZAutoPointer
            ((TPZAutoPointer<TPZDohrAssembly<float>_> *)in_RDI);
  if (*(long *)*in_RSI == 0) {
    local_48 = 0;
  }
  else {
    local_48 = __dynamic_cast(*(long *)*in_RSI,&TPZSavable::typeinfo,
                              &TPZDohrAssembly<float>::typeinfo,0);
  }
  if (local_48 != 0) {
    this = pTVar1->fPointer;
    if (this != (TPZDohrAssembly<float> *)0x0) {
      TPZAutoPointer<TPZDohrAssembly<float>_>::TPZReference::~TPZReference((TPZReference *)this);
      operator_delete(this,0x10);
    }
    pTVar1->fPointer = (TPZDohrAssembly<float> *)*in_RSI;
    TPZAutoPointer<TPZDohrAssembly<float>_>::TPZReference::Increment
              ((TPZReference *)pTVar1->fPointer);
  }
  return (TPZAutoPointer<TPZDohrAssembly<float>_>)in_RDI;
}

Assistant:

TPZAutoPointer<R> TPZAutoPointerDynamicCast(TPZAutoPointer<T> in) {
    TPZAutoPointer<R> rv;
    if (R* p; (p = dynamic_cast<R*> (in.fRef->fPointer)) ) {
        delete rv.fRef;
        rv.fRef = (typename TPZAutoPointer<R>::TPZReference *) in.fRef;
        rv.fRef->Increment();
    }
    return rv;
}